

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void prt_binary(bitflag *flags,wchar_t offset,wchar_t row,wchar_t col,wchar_t ch,wchar_t num)

{
  _Bool _Var1;
  int local_28;
  wchar_t flag;
  wchar_t num_local;
  wchar_t ch_local;
  wchar_t col_local;
  wchar_t row_local;
  wchar_t offset_local;
  bitflag *flags_local;
  
  num_local = col;
  for (local_28 = offset + L'\x01'; local_28 < offset + L'\x01' + num; local_28 = local_28 + 1) {
    _Var1 = flag_has_dbg(flags,6,local_28,"flags","flag");
    if (_Var1) {
      Term_putch(num_local,row,L'\x06',ch);
    }
    else {
      Term_putch(num_local,row,L'\x01',L'-');
    }
    num_local = num_local + L'\x01';
  }
  return;
}

Assistant:

static void prt_binary(const bitflag *flags, int offset, int row, int col,
	wchar_t ch, int num)
{
	int flag;

	/* Scan the flags. */
	for (flag = FLAG_START + offset; flag < FLAG_START + offset + num; flag++) {
		if (of_has(flags, flag)) {
			Term_putch(col++, row, COLOUR_BLUE, ch);
		} else {
			Term_putch(col++, row, COLOUR_WHITE, L'-');
		}
	}
}